

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O3

void __thiscall RangeLock_MoveAssign_Test::TestBody(RangeLock_MoveAssign_Test *this)

{
  bool bVar1;
  TypedExpectation<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  *pTVar2;
  ActionInterface<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  *pAVar3;
  TypedExpectation<void_(unsigned_long,_unsigned_long)> *pTVar4;
  pointer *__ptr;
  char *pcVar5;
  MatcherBase<pstore::file::file_base::blocking_mode> *gmock_a3;
  Expectation file1_unlock;
  range_lock target_lock;
  Expectation file2_unlock;
  Expectation file1_lock;
  Expectation file2_lock;
  range_lock source_lock;
  mock_file file1;
  mock_file file2;
  undefined1 local_8f8 [8];
  VTable *local_8f0;
  MatcherBase<unsigned_long> local_8e0;
  undefined1 local_8c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8b8 [2];
  MatcherBase<pstore::file::file_base::lock_kind> local_898;
  Expectation local_880;
  _Any_data local_870;
  _func_int **local_860;
  undefined4 local_858;
  char local_854;
  MatcherBase<pstore::file::file_base::blocking_mode> local_840;
  Expectation local_828;
  Expectation local_818;
  MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  local_808;
  bool *local_7a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_798;
  mock_file local_790;
  mock_file local_3e0;
  
  anon_unknown.dwarf_1431b::mock_file::mock_file(&local_790);
  anon_unknown.dwarf_1431b::mock_file::mock_file(&local_3e0);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)local_8c8,0xd);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)local_8f8,0x11);
  testing::Matcher<pstore::file::file_base::lock_kind>::Matcher
            ((Matcher<pstore::file::file_base::lock_kind> *)&local_8e0,exclusive_write);
  testing::Matcher<pstore::file::file_base::blocking_mode>::Matcher
            ((Matcher<pstore::file::file_base::blocking_mode> *)&local_898,blocking);
  anon_unknown.dwarf_1431b::mock_file::gmock_lock
            (&local_808,&local_790,(Matcher<unsigned_long> *)local_8c8,
             (Matcher<unsigned_long> *)local_8f8,
             (Matcher<pstore::file::file_base::lock_kind> *)&local_8e0,
             (Matcher<pstore::file::file_base::blocking_mode> *)&local_898);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::
           MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
           ::InternalExpectedAt
                     (&local_808,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                      ,0xb7,"file1",
                      "lock (13UL, std::size_t{17}, mock_file::lock_kind::exclusive_write, mock_file::blocking_mode::blocking)"
                     );
  local_880.expectation_base_.
  super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(1);
  *(bool *)&(local_880.expectation_base_.
             super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ExpectationBase = true;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>
            (&local_880.expectation_base_.
              super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             (bool *)local_880.expectation_base_.
                     super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  pAVar3 = (ActionInterface<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
            *)operator_new(0x10);
  pAVar3->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_001e5c20;
  bVar1 = *(bool *)&(local_880.expectation_base_.
                     super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_vptr_ExpectationBase;
  *(bool *)&pAVar3[1]._vptr_ActionInterface = bVar1;
  *(bool *)((long)&pAVar3[1]._vptr_ActionInterface + 1) = bVar1;
  testing::
  Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  ::Action((Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
            *)&local_870,pAVar3);
  pTVar2 = testing::internal::
           TypedExpectation<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
           ::WillOnce(pTVar2,(Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
                              *)&local_870);
  (*(pTVar2->super_ExpectationBase)._vptr_ExpectationBase[3])(&local_840,pTVar2);
  local_828.expectation_base_.
  super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_840.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
  local_828.expectation_base_.
  super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_840.vtable_;
  if (local_840.vtable_ != (VTable *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_840.vtable_)->describe = *(int *)&(local_840.vtable_)->describe + 1;
      UNLOCK();
    }
    else {
      *(int *)&(local_840.vtable_)->describe = *(int *)&(local_840.vtable_)->describe + 1;
    }
  }
  testing::Expectation::~Expectation((Expectation *)&local_840);
  if (local_860 != (_func_int **)0x0) {
    (*(code *)local_860)(&local_870,&local_870,3);
  }
  if (local_880.expectation_base_.
      super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_880.expectation_base_.
               super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)
             &local_808.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .super__Head_base<0UL,_testing::Matcher<unsigned_long>,_false>);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)
             &local_808.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .super__Head_base<1UL,_testing::Matcher<unsigned_long>,_false>);
  testing::internal::MatcherBase<pstore::file::file_base::lock_kind>::~MatcherBase
            ((MatcherBase<pstore::file::file_base::lock_kind> *)
             &local_808.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .
              super__Tuple_impl<2UL,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .super__Head_base<2UL,_testing::Matcher<pstore::file::file_base::lock_kind>,_false>);
  testing::internal::MatcherBase<pstore::file::file_base::blocking_mode>::~MatcherBase
            ((MatcherBase<pstore::file::file_base::blocking_mode> *)&local_808.matchers_);
  testing::internal::MatcherBase<pstore::file::file_base::blocking_mode>::~MatcherBase
            ((MatcherBase<pstore::file::file_base::blocking_mode> *)&local_898);
  testing::internal::MatcherBase<pstore::file::file_base::lock_kind>::~MatcherBase
            ((MatcherBase<pstore::file::file_base::lock_kind> *)&local_8e0);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)local_8f8);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)local_8c8);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)local_8f8,0x13);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_8e0,0x17);
  testing::Matcher<pstore::file::file_base::lock_kind>::Matcher
            ((Matcher<pstore::file::file_base::lock_kind> *)&local_898,shared_read);
  testing::Matcher<pstore::file::file_base::blocking_mode>::Matcher
            ((Matcher<pstore::file::file_base::blocking_mode> *)&local_840,blocking);
  gmock_a3 = &local_840;
  anon_unknown.dwarf_1431b::mock_file::gmock_lock
            (&local_808,&local_3e0,(Matcher<unsigned_long> *)local_8f8,
             (Matcher<unsigned_long> *)&local_8e0,
             (Matcher<pstore::file::file_base::lock_kind> *)&local_898,
             (Matcher<pstore::file::file_base::blocking_mode> *)gmock_a3);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::
           MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
           ::InternalExpectedAt
                     (&local_808,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                      ,0xbd,"file2",
                      "lock (19UL, std::size_t{23}, mock_file::lock_kind::shared_read, mock_file::blocking_mode::blocking)"
                     );
  testing::ExpectationSet::ExpectationSet((ExpectationSet *)&local_870,&local_828);
  pTVar2 = testing::internal::
           TypedExpectation<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
           ::After(pTVar2,(ExpectationSet *)&local_870);
  local_7a0 = (bool *)operator_new(1);
  *local_7a0 = true;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_798,local_7a0);
  pAVar3 = (ActionInterface<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
            *)operator_new(0x10);
  pAVar3->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_001e5c20;
  bVar1 = *local_7a0;
  *(bool *)&pAVar3[1]._vptr_ActionInterface = bVar1;
  *(bool *)((long)&pAVar3[1]._vptr_ActionInterface + 1) = bVar1;
  testing::
  Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  ::Action((Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
            *)local_8c8,pAVar3);
  pTVar2 = testing::internal::
           TypedExpectation<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
           ::WillOnce(pTVar2,(Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
                              *)local_8c8);
  (*(pTVar2->super_ExpectationBase)._vptr_ExpectationBase[3])(&local_880,pTVar2);
  local_818.expectation_base_.
  super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_880.expectation_base_.
       super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_818.expectation_base_.
  super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_880.expectation_base_.
          super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_880.expectation_base_.
      super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_880.expectation_base_.
       super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_880.expectation_base_.
            super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_880.expectation_base_.
       super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_880.expectation_base_.
            super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  testing::Expectation::~Expectation(&local_880);
  if ((code *)local_8b8[0]._0_8_ != (code *)0x0) {
    (*(code *)local_8b8[0]._0_8_)(local_8c8,local_8c8,3);
  }
  if (local_798._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_798._M_pi);
  }
  std::
  _Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
  ::~_Rb_tree((_Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
               *)&local_870);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)
             &local_808.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .super__Head_base<0UL,_testing::Matcher<unsigned_long>,_false>);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)
             &local_808.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .super__Head_base<1UL,_testing::Matcher<unsigned_long>,_false>);
  testing::internal::MatcherBase<pstore::file::file_base::lock_kind>::~MatcherBase
            ((MatcherBase<pstore::file::file_base::lock_kind> *)
             &local_808.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .
              super__Tuple_impl<2UL,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .super__Head_base<2UL,_testing::Matcher<pstore::file::file_base::lock_kind>,_false>);
  testing::internal::MatcherBase<pstore::file::file_base::blocking_mode>::~MatcherBase
            ((MatcherBase<pstore::file::file_base::blocking_mode> *)&local_808.matchers_);
  testing::internal::MatcherBase<pstore::file::file_base::blocking_mode>::~MatcherBase(&local_840);
  testing::internal::MatcherBase<pstore::file::file_base::lock_kind>::~MatcherBase(&local_898);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_8e0);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)local_8f8);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)local_8c8,0x13);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)local_8f8,0x17);
  anon_unknown.dwarf_1431b::mock_file::gmock_unlock
            ((MockSpec<void_(unsigned_long,_unsigned_long)> *)&local_808,&local_3e0,
             (Matcher<unsigned_long> *)local_8c8,(Matcher<unsigned_long> *)local_8f8);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<void_(unsigned_long,_unsigned_long)>::InternalExpectedAt
                     ((MockSpec<void_(unsigned_long,_unsigned_long)> *)&local_808,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                      ,0xc2,"file2","unlock (19UL, std::size_t{23})");
  testing::ExpectationSet::ExpectationSet((ExpectationSet *)&local_870,&local_818);
  pTVar4 = testing::internal::TypedExpectation<void_(unsigned_long,_unsigned_long)>::After
                     (pTVar4,(ExpectationSet *)&local_870);
  (*(pTVar4->super_ExpectationBase)._vptr_ExpectationBase[3])(&local_8e0,pTVar4);
  local_840.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       local_8e0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
  local_840.vtable_ = (VTable *)local_8e0.vtable_;
  if ((VTable *)local_8e0.vtable_ != (VTable *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_8e0.vtable_)->describe = *(int *)&(local_8e0.vtable_)->describe + 1;
      UNLOCK();
    }
    else {
      *(int *)&(local_8e0.vtable_)->describe = *(int *)&(local_8e0.vtable_)->describe + 1;
    }
  }
  testing::Expectation::~Expectation((Expectation *)&local_8e0);
  std::
  _Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
  ::~_Rb_tree((_Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
               *)&local_870);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)
             &local_808.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .
              super__Tuple_impl<2UL,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .super__Head_base<2UL,_testing::Matcher<pstore::file::file_base::lock_kind>,_false>);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&local_808.matchers_);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)local_8f8);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)local_8c8);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)local_8f8,0xd);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_8e0,0x11);
  anon_unknown.dwarf_1431b::mock_file::gmock_unlock
            ((MockSpec<void_(unsigned_long,_unsigned_long)> *)&local_808,&local_790,
             (Matcher<unsigned_long> *)local_8f8,(Matcher<unsigned_long> *)&local_8e0);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<void_(unsigned_long,_unsigned_long)>::InternalExpectedAt
                     ((MockSpec<void_(unsigned_long,_unsigned_long)> *)&local_808,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                      ,0xc4,"file1","unlock (13UL, std::size_t{17})");
  pTVar4 = testing::internal::TypedExpectation<void_(unsigned_long,_unsigned_long)>::Times(pTVar4,1)
  ;
  testing::ExpectationSet::ExpectationSet((ExpectationSet *)&local_870,&local_828);
  testing::ExpectationSet::ExpectationSet((ExpectationSet *)local_8c8,(Expectation *)&local_840);
  pTVar4 = testing::internal::TypedExpectation<void_(unsigned_long,_unsigned_long)>::After
                     (pTVar4,(ExpectationSet *)&local_870);
  pTVar4 = testing::internal::TypedExpectation<void_(unsigned_long,_unsigned_long)>::After
                     (pTVar4,(ExpectationSet *)local_8c8);
  (*(pTVar4->super_ExpectationBase)._vptr_ExpectationBase[3])(&local_898,pTVar4);
  local_880.expectation_base_.
  super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_898.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
  local_880.expectation_base_.
  super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_898.vtable_;
  if ((VTable *)local_898.vtable_ != (VTable *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_898.vtable_)->describe = *(int *)&(local_898.vtable_)->describe + 1;
      UNLOCK();
    }
    else {
      *(int *)&(local_898.vtable_)->describe = *(int *)&(local_898.vtable_)->describe + 1;
    }
  }
  testing::Expectation::~Expectation((Expectation *)&local_898);
  std::
  _Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
  ::~_Rb_tree((_Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
               *)local_8c8);
  std::
  _Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
  ::~_Rb_tree((_Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
               *)&local_870);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)
             &local_808.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .
              super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .
              super__Tuple_impl<2UL,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
              .super__Head_base<2UL,_testing::Matcher<pstore::file::file_base::lock_kind>,_false>);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&local_808.matchers_);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_8e0);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)local_8f8);
  pstore::file::range_lock::range_lock
            ((range_lock *)&local_808,&local_790.super_file_base,0xd,0x11,exclusive_write);
  pstore::file::range_lock::range_lock
            ((range_lock *)&local_870,&local_3e0.super_file_base,0x13,0x17,shared_read);
  pstore::file::range_lock::lock((range_lock *)&local_808);
  pstore::file::range_lock::lock((range_lock *)&local_870);
  pstore::file::range_lock::operator=((range_lock *)&local_870,(range_lock *)&local_808);
  local_8f8 = (undefined1  [8])local_808.function_mocker_;
  local_8e0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = (_func_int **)0x0;
  testing::internal::CmpHelperEQ<pstore::file::file_base*,pstore::file::file_base*>
            ((internal *)local_8c8,"nullptr","source_lock.file ()",(file_base **)&local_8e0,
             (file_base **)local_8f8);
  if (local_8c8[0] == '\0') {
    testing::Message::Message((Message *)local_8f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_8f8 + 0x10),
               "The file associated with the source of a move assignment should be null",0x47);
    if ((VTable *)local_8c8._8_8_ == (VTable *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_8c8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_8e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0xdc,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_8e0,(Message *)local_8f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_8e0);
    if (local_8f8 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_8f8 + 8))();
    }
  }
  if ((VTable *)local_8c8._8_8_ != (VTable *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_8c8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_8c8._8_8_);
  }
  local_8f8 = (undefined1  [8])
              (CONCAT71(local_8f8._1_7_,
                        local_808.matchers_.
                        super__Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
                        .
                        super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
                        .
                        super__Tuple_impl<2UL,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
                        .
                        super__Tuple_impl<3UL,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
                        .
                        super__Head_base<3UL,_testing::Matcher<pstore::file::file_base::blocking_mode>,_false>
                        ._M_head_impl.super_MatcherBase<pstore::file::file_base::blocking_mode>.
                        buffer_.i._4_1_) ^ 1);
  local_8f0 = (VTable *)0x0;
  if (local_808.matchers_.
      super__Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
      .
      super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
      .
      super__Tuple_impl<2UL,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
      .super__Tuple_impl<3UL,_testing::Matcher<pstore::file::file_base::blocking_mode>_>.
      super__Head_base<3UL,_testing::Matcher<pstore::file::file_base::blocking_mode>,_false>.
      _M_head_impl.super_MatcherBase<pstore::file::file_base::blocking_mode>.buffer_.i._4_1_ != '\0'
     ) {
    testing::Message::Message((Message *)&local_8e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               (local_8e0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 2),
               "The source of a move assignment should not be locked",0x34);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_8c8,(internal *)local_8f8,
               (AssertionResult *)"source_lock.is_locked ()","true","false",(char *)gmock_a3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_898,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0xde,(char *)CONCAT71(local_8c8._1_7_,local_8c8[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_898,(Message *)&local_8e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_898);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_8c8._1_7_,local_8c8[0]) != local_8b8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_8c8._1_7_,local_8c8[0]),
                      (ulong)(local_8b8[0]._M_allocated_capacity + 1));
    }
    if (local_8e0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
        (_func_int **)0x0) {
      (**(code **)(*local_8e0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 8))
                ();
    }
    if (local_8f0 != (VTable *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_8f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8f0);
    }
  }
  local_8e0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)local_870._M_unused._0_8_;
  local_8f8 = (undefined1  [8])&local_790;
  testing::internal::EqHelper::
  Compare<(anonymous_namespace)::mock_file_*,_pstore::file::file_base_*,_nullptr>
            ((EqHelper *)local_8c8,"&file1","target_lock.file ()",(mock_file **)local_8f8,
             (file_base **)&local_8e0);
  if (local_8c8[0] == '\0') {
    testing::Message::Message((Message *)local_8f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_8f8 + 0x10),
               "The file associated with the target of the move is wrong",0x38);
    if ((VTable *)local_8c8._8_8_ == (VTable *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_8c8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_8e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0xe3,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_8e0,(Message *)local_8f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_8e0);
    if (local_8f8 != (undefined1  [8])0x0) {
      (*(*(_func_int ***)local_8f8)[1])();
    }
  }
  if ((VTable *)local_8c8._8_8_ != (VTable *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_8c8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_8c8._8_8_);
  }
  local_8f8 = (undefined1  [8])&DAT_0000000d;
  local_8e0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)local_870._8_8_;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_8c8,"13UL","target_lock.offset ()",(unsigned_long *)local_8f8,
             (unsigned_long *)&local_8e0);
  if (local_8c8[0] == '\0') {
    testing::Message::Message((Message *)local_8f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_8f8 + 0x10),
               "The offset of the move target range_lock is wrong",0x31);
    if ((VTable *)local_8c8._8_8_ == (VTable *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_8c8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_8e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0xe5,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_8e0,(Message *)local_8f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_8e0);
    if (local_8f8 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_8f8 + 8))();
    }
  }
  if ((VTable *)local_8c8._8_8_ != (VTable *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_8c8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_8c8._8_8_);
  }
  local_8f8 = (undefined1  [8])&DAT_00000011;
  local_8e0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = local_860;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_8c8,"std::size_t{17}","target_lock.size ()",
             (unsigned_long *)local_8f8,(unsigned_long *)&local_8e0);
  if (local_8c8[0] == '\0') {
    testing::Message::Message((Message *)local_8f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_8f8 + 0x10),"The size of the move target range_lock is wrong"
               ,0x2f);
    if ((VTable *)local_8c8._8_8_ == (VTable *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_8c8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_8e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0xe7,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_8e0,(Message *)local_8f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_8e0);
    if (local_8f8 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_8f8 + 8))();
    }
  }
  if ((VTable *)local_8c8._8_8_ != (VTable *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_8c8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_8c8._8_8_);
  }
  local_8f8._0_4_ = 1;
  local_8e0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_4_ = local_858;
  testing::internal::
  CmpHelperEQ<pstore::file::file_base::lock_kind,pstore::file::file_base::lock_kind>
            ((internal *)local_8c8,"mock_file::lock_kind::exclusive_write","target_lock.kind ()",
             (lock_kind *)local_8f8,(lock_kind *)&local_8e0);
  if (local_8c8[0] == '\0') {
    testing::Message::Message((Message *)local_8f8);
    if ((VTable *)local_8c8._8_8_ == (VTable *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_8c8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_8e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0xe9,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_8e0,(Message *)local_8f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_8e0);
    if (local_8f8 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_8f8 + 8))();
    }
  }
  if ((VTable *)local_8c8._8_8_ != (VTable *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_8c8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_8c8._8_8_);
  }
  local_8f8[0] = local_854;
  local_8f0 = (VTable *)0x0;
  if (local_854 == '\0') {
    testing::Message::Message((Message *)&local_8e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               (local_8e0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 2),
               "Expected the target of the move operation to be locked",0x36);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_8c8,(internal *)local_8f8,
               (AssertionResult *)"target_lock.is_locked ()","false","true",(char *)gmock_a3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_898,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0xea,(char *)CONCAT71(local_8c8._1_7_,local_8c8[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_898,(Message *)&local_8e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_898);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_8c8._1_7_,local_8c8[0]) != local_8b8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_8c8._1_7_,local_8c8[0]),
                      (ulong)(local_8b8[0]._M_allocated_capacity + 1));
    }
    if (local_8e0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
        (_func_int **)0x0) {
      (**(code **)(*local_8e0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 8))
                ();
    }
    if (local_8f0 != (VTable *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_8f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8f0);
    }
  }
  pstore::file::range_lock::unlock((range_lock *)&local_870);
  pstore::file::range_lock::~range_lock((range_lock *)&local_870);
  pstore::file::range_lock::~range_lock((range_lock *)&local_808);
  testing::Expectation::~Expectation(&local_880);
  testing::Expectation::~Expectation((Expectation *)&local_840);
  testing::Expectation::~Expectation(&local_818);
  testing::Expectation::~Expectation(&local_828);
  testing::internal::FunctionMocker<void_(unsigned_long,_unsigned_long)>::~FunctionMocker
            (&local_3e0.gmock02_unlock_96);
  testing::internal::
  FunctionMocker<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  ::~FunctionMocker(&local_3e0.gmock04_lock_95);
  testing::internal::FunctionMocker<long_()>::~FunctionMocker(&local_3e0.gmock10_latest_time_93);
  testing::internal::FunctionMocker<void_(unsigned_long)>::~FunctionMocker
            (&local_3e0.gmock01_truncate_92);
  testing::internal::FunctionMocker<unsigned_long_()>::~FunctionMocker(&local_3e0.gmock00_size_91);
  testing::internal::FunctionMocker<void_(pstore::gsl::not_null<const_void_*>,_unsigned_long)>::
  ~FunctionMocker(&local_3e0.gmock02_write_buffer_90);
  testing::internal::FunctionMocker<unsigned_long_(pstore::gsl::not_null<void_*>,_unsigned_long)>::
  ~FunctionMocker(&local_3e0.gmock02_read_buffer_89);
  testing::internal::FunctionMocker<unsigned_long_()>::~FunctionMocker(&local_3e0.gmock00_tell_88);
  testing::internal::FunctionMocker<void_(unsigned_long)>::~FunctionMocker
            (&local_3e0.gmock01_seek_87);
  testing::internal::
  FunctionMocker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::~FunctionMocker(&local_3e0.gmock10_path_86);
  testing::internal::FunctionMocker<bool_()>::~FunctionMocker
            (&local_3e0.gmock10_is_writable_hook_83);
  testing::internal::FunctionMocker<bool_()>::~FunctionMocker(&local_3e0.gmock10_is_open_hook_80);
  testing::internal::FunctionMocker<void_()>::~FunctionMocker(&local_3e0.gmock00_close_76);
  pstore::file::file_base::~file_base(&local_3e0.super_file_base);
  testing::internal::FunctionMocker<void_(unsigned_long,_unsigned_long)>::~FunctionMocker
            (&local_790.gmock02_unlock_96);
  testing::internal::
  FunctionMocker<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  ::~FunctionMocker(&local_790.gmock04_lock_95);
  testing::internal::FunctionMocker<long_()>::~FunctionMocker(&local_790.gmock10_latest_time_93);
  testing::internal::FunctionMocker<void_(unsigned_long)>::~FunctionMocker
            (&local_790.gmock01_truncate_92);
  testing::internal::FunctionMocker<unsigned_long_()>::~FunctionMocker(&local_790.gmock00_size_91);
  testing::internal::FunctionMocker<void_(pstore::gsl::not_null<const_void_*>,_unsigned_long)>::
  ~FunctionMocker(&local_790.gmock02_write_buffer_90);
  testing::internal::FunctionMocker<unsigned_long_(pstore::gsl::not_null<void_*>,_unsigned_long)>::
  ~FunctionMocker(&local_790.gmock02_read_buffer_89);
  testing::internal::FunctionMocker<unsigned_long_()>::~FunctionMocker(&local_790.gmock00_tell_88);
  testing::internal::FunctionMocker<void_(unsigned_long)>::~FunctionMocker
            (&local_790.gmock01_seek_87);
  testing::internal::
  FunctionMocker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::~FunctionMocker(&local_790.gmock10_path_86);
  testing::internal::FunctionMocker<bool_()>::~FunctionMocker
            (&local_790.gmock10_is_writable_hook_83);
  testing::internal::FunctionMocker<bool_()>::~FunctionMocker(&local_790.gmock10_is_open_hook_80);
  testing::internal::FunctionMocker<void_()>::~FunctionMocker(&local_790.gmock00_close_76);
  pstore::file::file_base::~file_base(&local_790.super_file_base);
  return;
}

Assistant:

TEST (RangeLock, MoveAssign) {
    mock_file file1;
    mock_file file2;

    using ::testing::_;
    using ::testing::Expectation;
    using ::testing::Return;

    Expectation file1_lock = EXPECT_CALL (file1, lock (UINT64_C (13),   // offset
                                                       std::size_t{17}, // size
                                                       mock_file::lock_kind::exclusive_write,
                                                       mock_file::blocking_mode::blocking))
                                 .WillOnce (Return (true));

    Expectation file2_lock = EXPECT_CALL (file2, lock (UINT64_C (19),   // offset
                                                       std::size_t{23}, // size
                                                       mock_file::lock_kind::shared_read,
                                                       mock_file::blocking_mode::blocking))
                                 .After (file1_lock)
                                 .WillOnce (Return (true));

    Expectation file2_unlock =
        EXPECT_CALL (file2, unlock (UINT64_C (19), std::size_t{23})).After (file2_lock);

    Expectation file1_unlock = EXPECT_CALL (file1, unlock (UINT64_C (13), std::size_t{17}))
                                   .Times (1)
                                   .After (file1_lock, file2_unlock);



    pstore::file::range_lock source_lock (&file1,
                                          UINT64_C (13),   // offset
                                          std::size_t{17}, // size
                                          mock_file::lock_kind::exclusive_write);
    pstore::file::range_lock target_lock (&file2,
                                          UINT64_C (19),   // offset
                                          std::size_t{23}, // size
                                          mock_file::lock_kind::shared_read);

    // Lock both the source and target of the assignment, just to be tricky.
    source_lock.lock ();
    target_lock.lock ();
    target_lock = std::move (source_lock);

// Clang SA (correctly) warns that this is (strictly) undefined behavior. However, the
// moved-from type is defined here and so is its behaviour that I would like to test.
#ifndef __clang_analyzer__
    // Check that lock1 was "destroyed" by the move
    EXPECT_EQ (nullptr, source_lock.file ())
        << "The file associated with the source of a move assignment should be null";
    EXPECT_FALSE (source_lock.is_locked ())
        << "The source of a move assignment should not be locked";
#endif

    // Check that lock2 matches the state of lock1 before the move
    EXPECT_EQ (&file1, target_lock.file ())
        << "The file associated with the target of the move is wrong";
    EXPECT_EQ (UINT64_C (13), target_lock.offset ())
        << "The offset of the move target range_lock is wrong";
    EXPECT_EQ (std::size_t{17}, target_lock.size ())
        << "The size of the move target range_lock is wrong";
    EXPECT_EQ (mock_file::lock_kind::exclusive_write, target_lock.kind ());
    EXPECT_TRUE (target_lock.is_locked ())
        << "Expected the target of the move operation to be locked";

    target_lock.unlock ();
}